

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int supsmu_(int *n,double *x,double *y,double *w,int *iper,double *span,double *alpha,double *smo,
           double *sc)

{
  double *pdVar1;
  int iVar2;
  uint uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double local_78;
  double h__;
  double local_68;
  double *local_60;
  double *local_58;
  uint *local_50;
  double *local_48;
  double local_40;
  double vsmlsq;
  int i__1;
  int jper;
  uint uVar3;
  
  uVar4 = *n;
  uVar7 = (ulong)(int)uVar4;
  if (x[uVar7 - 1] <= *x) {
    dVar14 = 0.0;
    dVar15 = 0.0;
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        dVar15 = dVar15 + y[uVar7] * w[uVar7];
        dVar14 = dVar14 + w[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        smo[uVar7] = (double)(-(ulong)(0.0 < dVar14) & (ulong)(dVar15 / dVar14));
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
  }
  else {
    uVar3 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar3 = uVar4;
    }
    iVar2 = (int)uVar3 >> 2;
    iVar10 = iVar2 * 3;
    dVar15 = x[(long)iVar10 + -1] - x[(long)iVar2 + -1];
    while (dVar15 <= 0.0) {
      iVar10 = iVar10 + (uint)(iVar10 < (int)uVar4);
      iVar2 = iVar2 - (uint)(1 < iVar2);
      dVar15 = x[(long)iVar10 + -1] - x[(long)iVar2 + -1];
    }
    local_40 = dVar15 * consts_.e_1[2] * dVar15 * consts_.e_1[2];
    vsmlsq._4_4_ = *iper;
    if ((vsmlsq._4_4_ == 2) && ((1.0 < x[uVar7 - 1] || (*x < 0.0)))) {
      vsmlsq._4_4_ = 1;
    }
    iVar10 = 1;
    if (0xfffffffd < vsmlsq._4_4_ - 3U) {
      iVar10 = vsmlsq._4_4_;
    }
    vsmlsq._4_4_ = iVar10;
    if (*span <= 0.0) {
      uVar5 = ~uVar7;
      local_48 = sc + uVar5;
      h__ = (double)(local_48 + uVar7 * 7 + 1);
      lVar12 = 0;
      local_68 = (double)CONCAT44(local_68._4_4_,-iVar10);
      pdVar8 = sc + uVar7 + uVar5 + 1;
      pdVar6 = sc + uVar5 + uVar7 * 2 + 1;
      local_60 = y;
      local_58 = w;
      local_50 = (uint *)n;
      do {
        dVar15 = h__;
        smooth_((int *)local_50,x,local_60,local_58,(double *)((long)spans_.e_1 + lVar12),
                (int *)((long)&vsmlsq + 4),&local_40,pdVar8,(double *)h__);
        vsmlsq._0_4_ = local_68._0_4_;
        smooth_((int *)local_50,x,(double *)dVar15,local_58,spans_.e_1 + 1,(int *)&vsmlsq,&local_40,
                pdVar6,&local_78);
        pdVar1 = local_48;
        pdVar8 = pdVar8 + uVar7 * 2;
        pdVar6 = pdVar6 + uVar7 * 2;
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x18);
      vsmlsq._0_4_ = *local_50;
      uVar13 = (ulong)vsmlsq._0_4_;
      pdVar6 = (double *)h__;
      pdVar8 = local_48;
      if (0 < (int)vsmlsq._0_4_) {
        local_60 = local_48 + uVar7 * 6;
        lVar12 = 1;
        do {
          lVar9 = 0;
          dVar15 = consts_.e_1[0];
          iVar10 = uVar4 * 2;
          do {
            dVar14 = pdVar8[lVar12 + iVar10];
            if (dVar14 < dVar15) {
              pdVar1[uVar7 * 7 + lVar12] = *(double *)((long)spans_.e_1 + lVar9);
              dVar15 = dVar14;
            }
            lVar9 = lVar9 + 8;
            iVar10 = iVar10 + uVar4 * 2;
          } while (lVar9 != 0x18);
          if ((((0.0 < *alpha) && (*alpha <= 10.0)) && (0.0 < dVar15)) &&
             (dVar15 < local_60[lVar12])) {
            dVar15 = pmax(consts_.e_1[1],dVar15 / local_60[lVar12]);
            local_68 = spans_.e_1[2] - pdVar1[uVar7 * 7 + lVar12];
            dVar15 = pow(dVar15,10.0 - *alpha);
            pdVar1[uVar7 * 7 + lVar12] = dVar15 * local_68 + pdVar1[uVar7 * 7 + lVar12];
            pdVar6 = (double *)h__;
            pdVar8 = local_48;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != uVar13 + 1);
      }
      n = (int *)local_50;
      iVar10 = -vsmlsq._4_4_;
      vsmlsq._0_4_ = iVar10;
      smooth_((int *)local_50,x,pdVar6,local_58,spans_.e_1 + 1,(int *)&vsmlsq,&local_40,
              pdVar8 + (int)(uVar4 * 2 + 1),&local_78);
      uVar3 = *n;
      if (0 < (int)uVar3) {
        lVar12 = (long)(int)(uVar4 * 2) * 8 + 8;
        lVar9 = 0;
        do {
          if (*(double *)((long)local_48 + lVar9 + lVar12) <= spans_.e_1[0]) {
            *(double *)((long)local_48 + lVar9 + lVar12) = spans_.e_1[0];
          }
          if (spans_.e_1[2] <= *(double *)((long)local_48 + lVar9 + lVar12)) {
            *(double *)((long)local_48 + lVar9 + lVar12) = spans_.e_1[2];
          }
          dVar15 = *(double *)((long)local_48 + lVar9 + lVar12) - spans_.e_1[1];
          if (0.0 <= dVar15) {
            dVar15 = dVar15 / (spans_.e_1[2] - spans_.e_1[1]);
            uVar11 = uVar4 * 5;
          }
          else {
            dVar15 = -dVar15 / (spans_.e_1[1] - spans_.e_1[0]);
            uVar11 = uVar4;
          }
          *(double *)((long)local_48 + lVar9 + (long)(int)(uVar4 * 4) * 8 + 8) =
               (1.0 - dVar15) * *(double *)((long)local_48 + lVar9 + (long)(int)(uVar4 * 3) * 8 + 8)
               + dVar15 * *(double *)((long)sc + lVar9 + (long)(int)uVar11 * 8 + uVar5 * 8 + 8);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar3 << 3 != lVar9);
      }
      pdVar6 = &vsmlsq;
      y = local_48 + (int)(uVar4 * 4 + 1);
      sc = &local_78;
      w = local_58;
      span = spans_.e_1;
      vsmlsq._0_4_ = iVar10;
    }
    else {
      pdVar6 = (double *)((long)&vsmlsq + 4);
    }
    uVar4 = smooth_(n,x,y,w,span,(int *)pdVar6,&local_40,smo,sc);
  }
  return uVar4;
}

Assistant:

static int supsmu_(int *n, double *x, double *y, double *w, int *iper, double *span, double *alpha, double *smo, double *sc)
{
    /* System generated locals */
    int sc_dim1, sc_offset, i__1;
    double r__1, r__2;
    double d__1, d__2;

    /* Local variables */
    double a, f, h__;
    int i__, j;
    double sw, sy;
    int jper;
    double scale, resmin;
    double vsmlsq;


/* ------------------------------------------------------------------ */

/* super-smoother. */

/* Friedman J.H. (1984). A variable span smoother. Department of Statistics, */
/*    Stanford University, Technical Report LCS5. */

/* version 10/10/84. */

/* coded  and copyright (c) 1984 by: */

/*                        Jerome H. Friedman */
/*                     Department of Statistics */
/*                               and */
/*                Stanford Linear Accelerator Center */
/*                        Stanford University */

/* all rights reserved. */


/* input: */
/*    n : number of observations (x,y - pairs). */
/*    x(n) : ordered abscissa values. */
/*    y(n) : corresponding ordinate (response) values. */
/*    w(n) : weight for each (x,y) observation. */
/*    iper : periodic variable flag. */
/*       iper=1 => x is ordered interval variable. */
/*       iper=2 => x is a periodic variable with values */
/*                 in the range (0.0,1.0) and period 1.0. */
/*    span : smoother span (fraction of observations in window). */
/*           span=0.0 => automatic (variable) span selection. */
/*    alpha : controles high frequency (small span) penality */
/*            used with automatic span selection (bass tone control). */
/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.) */
/* output: */
/*   smo(n) : smoothed ordinate (response) values. */
/* scratch: */
/*   sc(n,7) : internal working storage. */

/* note: */
/*    for small samples (n < 40) or if there are substantial serial */
/*    correlations between obserations close in x - value, then */
/*    a prespecified fixed span smoother (span > 0) should be */
/*    used. reasonable span values are 0.2 to 0.4. */

/* ------------------------------------------------------------------ */

    /* Parameter adjustments */
    sc_dim1 = *n;
    sc_offset = 1 + sc_dim1;
    sc -= sc_offset;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    if (x[*n] > x[1]) {
	goto L30;
    }
    sy = 0.0;
    sw = sy;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sy += w[j] * y[j];
	sw += w[j];
/* L10: */
    }
    a = 0.0;
    if (sw > 0.0) {
	a = sy / sw;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	smo[j] = a;
/* L20: */
    }
    return 0;
L30:
    i__ = *n / 4;
    j = i__ * 3;
    scale = x[j] - x[i__];
L40:
    if (scale > 0.f) {
	goto L50;
    }
    if (j < *n) {
	++j;
    }
    if (i__ > 1) {
	--i__;
    }
    scale = x[j] - x[i__];
    goto L40;
L50:
/* Computing 2nd power */
    r__1 = consts_1.eps * scale;
    vsmlsq = r__1 * r__1;
    jper = *iper;
    if (*iper == 2 && (x[1] < 0.0 || x[*n] > 1.0)) {
	jper = 1;
    }
    if (jper < 1 || jper > 2) {
	jper = 1;
    }
    if (*span <= 0.0) {
	goto L60;
    }
    smooth_(n, &x[1], &y[1], &w[1], span, &jper, &vsmlsq, &smo[1], &sc[
	    sc_offset]);
    return 0;
L60:
    for (i__ = 1; i__ <= 3; ++i__) {
	smooth_(n, &x[1], &y[1], &w[1], &spans_1.spans[i__ - 1], &jper, &
		vsmlsq, &sc[((i__ << 1) - 1) * sc_dim1 + 1], &sc[sc_dim1 * 7 
		+ 1]);
	i__1 = -jper;
	smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &
		i__1, &vsmlsq, &sc[(i__ << 1) * sc_dim1 + 1], &h__);
/* L70: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	resmin = consts_1.big;
	for (i__ = 1; i__ <= 3; ++i__) {
	    if (sc[j + (i__ << 1) * sc_dim1] >= resmin) {
		goto L80;
	    }
	    resmin = sc[j + (i__ << 1) * sc_dim1];
	    sc[j + sc_dim1 * 7] = spans_1.spans[i__ - 1];
L80:
	    ;
	}
	if (*alpha > 0.f && *alpha <= 10.f && resmin < sc[j + sc_dim1 * 6] && 
		resmin > 0.f) {
/* Computing MAX */
	    r__1 = consts_1.sml, r__2 = resmin / sc[j + sc_dim1 * 6];
	    d__1 = (double) pmax(r__1,r__2);
	    d__2 = (double) (10.0 - *alpha);
	    sc[j + sc_dim1 * 7] += (spans_1.spans[2] - sc[j + sc_dim1 * 7]) * 
		    pow(d__1, d__2);
	}
/* L90: */
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[sc_dim1 * 7 + 1], &w[1], &spans_1.spans[1], &i__1, &
	    vsmlsq, &sc[(sc_dim1 << 1) + 1], &h__);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (sc[j + (sc_dim1 << 1)] <= spans_1.spans[0]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[0];
	}
	if (sc[j + (sc_dim1 << 1)] >= spans_1.spans[2]) {
	    sc[j + (sc_dim1 << 1)] = spans_1.spans[2];
	}
	f = sc[j + (sc_dim1 << 1)] - spans_1.spans[1];
	if (f >= 0.f) {
	    goto L100;
	}
	f = -f / (spans_1.spans[1] - spans_1.spans[0]);
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1];
	goto L110;
L100:
	f /= spans_1.spans[2] - spans_1.spans[1];
	sc[j + (sc_dim1 << 2)] = (1.f - f) * sc[j + sc_dim1 * 3] + f * sc[j + 
		sc_dim1 * 5];
L110:
	;
    }
    i__1 = -jper;
    smooth_(n, &x[1], &sc[(sc_dim1 << 2) + 1], &w[1], spans_1.spans, &i__1, &
	    vsmlsq, &smo[1], &h__);
    return 0;
}